

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O1

void addJsonValue(QJsonValue *value,QString *keyPrefix,ProValueMap *map)

{
  double dVar1;
  byte bVar2;
  undefined4 uVar3;
  QArrayDataPointer<QString> *this;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QString local_88;
  QArrayDataPointer<QString> local_68;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = QJsonValue::type();
  switch(uVar3) {
  case 1:
    local_48.d = (Data *)0x0;
    local_48.ptr = (QString *)0x0;
    local_48.size = 0;
    bVar2 = QJsonValue::toBool(SUB81(value,0));
    QVar4.m_data = (storage_type *)((ulong)bVar2 ^ 5);
    QVar4.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar4);
    local_88.d.d = (Data *)local_68.d;
    local_88.d.ptr = (char16_t *)local_68.ptr;
    local_88.d.size = local_68.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_48,local_48.size,&local_88);
    QList<QString>::end((QList<QString> *)&local_48);
    insertJsonKeyValue(keyPrefix,(QStringList *)&local_48,map);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
    this = &local_48;
    goto LAB_0026defd;
  case 2:
    local_68.d = (Data *)0x0;
    local_68.ptr = (QString *)0x0;
    local_68.size = 0;
    dVar1 = (double)QJsonValue::toDouble(0.0);
    QString::number(dVar1,(char)&local_48,0x67);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_68,local_68.size,(QString *)&local_48);
    QList<QString>::end((QList<QString> *)&local_68);
    insertJsonKeyValue(keyPrefix,(QStringList *)&local_68,map);
    goto LAB_0026deda;
  case 3:
    local_68.d = (Data *)0x0;
    local_68.ptr = (QString *)0x0;
    local_68.size = 0;
    QJsonValue::toString();
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_68,local_68.size,(QString *)&local_48);
    QList<QString>::end((QList<QString> *)&local_68);
    insertJsonKeyValue(keyPrefix,(QStringList *)&local_68,map);
LAB_0026deda:
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d)->super_QArrayData,2,0x10);
      }
    }
    this = &local_68;
LAB_0026defd:
    QArrayDataPointer<QString>::~QArrayDataPointer(this);
    break;
  case 4:
    QJsonValue::toArray();
    local_48.ptr = (QString *)CONCAT71(local_48.ptr._1_7_,0x2e);
    local_48.d = (Data *)keyPrefix;
    QStringBuilder<const_QString_&,_QLatin1Char>::convertTo<QString>
              ((QString *)&local_68,(QStringBuilder<const_QString_&,_QLatin1Char> *)&local_48);
    addJsonArray((QJsonArray *)&local_88,(QString *)&local_68,map);
    if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d)->super_QArrayData,2,0x10);
      }
    }
    QJsonArray::~QJsonArray((QJsonArray *)&local_88);
    break;
  case 5:
    QJsonValue::toObject();
    local_48.ptr = (QString *)CONCAT71(local_48.ptr._1_7_,0x2e);
    local_48.d = (Data *)keyPrefix;
    QStringBuilder<const_QString_&,_QLatin1Char>::convertTo<QString>
              ((QString *)&local_68,(QStringBuilder<const_QString_&,_QLatin1Char> *)&local_48);
    addJsonObject((QJsonObject *)&local_88,(QString *)&local_68,map);
    if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d)->super_QArrayData,2,0x10);
      }
    }
    QJsonObject::~QJsonObject((QJsonObject *)&local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void addJsonValue(const QJsonValue &value, const QString &keyPrefix, ProValueMap *map)
{
    switch (value.type()) {
    case QJsonValue::Bool:
        insertJsonKeyValue(keyPrefix, QStringList() << (value.toBool() ? QLatin1String("true") : QLatin1String("false")), map);
        break;
    case QJsonValue::Double:
        insertJsonKeyValue(keyPrefix, QStringList() << QString::number(value.toDouble()), map);
        break;
    case QJsonValue::String:
        insertJsonKeyValue(keyPrefix, QStringList() << value.toString(), map);
        break;
    case QJsonValue::Array:
        addJsonArray(value.toArray(), keyPrefix + QLatin1Char('.'), map);
        break;
    case QJsonValue::Object:
        addJsonObject(value.toObject(), keyPrefix + QLatin1Char('.'), map);
        break;
    default:
        break;
    }
}